

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>
::load(list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  make_caster<std::pair<Eigen::Matrix<double,_1,_3>,_double>_&&> *caster;
  sequence_iterator sVar2;
  sequence_slow_readwrite sVar3;
  template_cast_op_type<typename_std::add_rvalue_reference<pair<Matrix<double,_1,_3>,_double>_&&>::type>
  local_100;
  uint local_dc;
  handle local_d8;
  PyObject *local_d0;
  undefined1 local_c8 [8];
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence local_50;
  PyObject *local_48;
  sequence local_40;
  sequence s;
  bool convert_local;
  list_caster<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>
  *this_local;
  handle src_local;
  
  bVar1 = isinstance<pybind11::sequence,_0>(src);
  if ((!bVar1) ||
     (s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr,
     bVar1 = isinstance<pybind11::str,_0>(src), bVar1)) {
    src_local.m_ptr._7_1_ = 0;
  }
  else {
    local_48 = src.m_ptr;
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_40,src);
    std::
    vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>
    ::clear(&this->value);
    sequence::sequence(&local_50,&local_40);
    reserve_maybe<std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>,_0>
              (this,&local_50,&this->value);
    sequence::~sequence(&local_50);
    sVar2 = sequence::begin(&local_40);
    __end3.super_sequence_slow_readwrite.index =
         (ssize_t)sVar2.super_sequence_slow_readwrite.obj.m_ptr;
    sVar3 = (sequence_slow_readwrite)sequence::end(&local_40);
    while( true ) {
      __end3.super_sequence_slow_readwrite.obj.m_ptr = (PyObject *)sVar3.index;
      it.cache.super_handle.m_ptr = sVar3.obj.m_ptr;
      bVar1 = detail::operator!=((It *)&__end3.super_sequence_slow_readwrite.index,(It *)&it.cache);
      if (!bVar1) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((reference *)
                 &conv.super_tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>.
                  subcasters.second,
                 (generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      type_caster<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_void>::type_caster
                ((type_caster<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_void> *)
                 local_c8);
      accessor::operator_cast_to_object((accessor *)&local_d8);
      local_d0 = local_d8.m_ptr;
      bVar1 = tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>::load
                        ((tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double> *)
                         local_c8,local_d8,convert);
      pybind11::object::~object((object *)&local_d8);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        src_local.m_ptr._7_1_ = 0;
      }
      else {
        cast_op<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>&&>
                  (&local_100,(detail *)local_c8,caster);
        std::
        vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>
        ::push_back(&this->value,&local_100);
      }
      local_dc = (uint)bVar1;
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 &conv.super_tuple_caster<std::pair,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>.
                  subcasters.second);
      if (local_dc != 0) goto LAB_004bdb1a;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      sVar3.index = (ssize_t)__end3.super_sequence_slow_readwrite.obj.m_ptr;
      sVar3.obj = it.cache.super_handle.m_ptr;
    }
    src_local.m_ptr._7_1_ = 1;
    local_dc = 1;
LAB_004bdb1a:
    sequence::~sequence(&local_40);
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }